

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestParsingMerge_RepeatedFieldsGenerator_Group2::
~TestParsingMerge_RepeatedFieldsGenerator_Group2
          (TestParsingMerge_RepeatedFieldsGenerator_Group2 *this)

{
  TestParsingMerge_RepeatedFieldsGenerator_Group2 *this_local;
  
  ~TestParsingMerge_RepeatedFieldsGenerator_Group2(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestParsingMerge_RepeatedFieldsGenerator_Group2::~TestParsingMerge_RepeatedFieldsGenerator_Group2() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMerge.RepeatedFieldsGenerator.Group2)
  SharedDtor(*this);
}